

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

void xmlNextChar(xmlParserCtxtPtr ctxt)

{
  int *piVar1;
  xmlChar **ppxVar2;
  byte bVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  byte *pbVar7;
  ulong uVar8;
  
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (pxVar4 = ctxt->input, pxVar4 != (xmlParserInputPtr)0x0)) {
    uVar8 = (long)pxVar4->end - (long)pxVar4->cur;
    if (uVar8 < 0xfa) {
      xmlParserGrow(ctxt);
      pxVar5 = ctxt->input->cur;
      pxVar6 = ctxt->input->end;
      if (pxVar6 <= pxVar5) {
        return;
      }
      uVar8 = (long)pxVar6 - (long)pxVar5;
    }
    pxVar4 = ctxt->input;
    pbVar7 = pxVar4->cur;
    bVar3 = *pbVar7;
    if ((char)bVar3 < '\0') {
      pxVar4->col = pxVar4->col + 1;
      if ((((uVar8 < 2) || ((pbVar7[1] & 0xc0) != 0x80)) || (0xdf < bVar3)) || (bVar3 < 0xc2)) {
        if ((pxVar4->flags & 0x20) == 0) {
          xmlCtxtErrIO(ctxt,0x51,(char *)0x0);
          piVar1 = &ctxt->input->flags;
          *piVar1 = *piVar1 | 0x20;
        }
        ppxVar2 = &ctxt->input->cur;
        *ppxVar2 = *ppxVar2 + 1;
      }
      else {
        pxVar4->cur = pbVar7 + 2;
      }
    }
    else {
      if (bVar3 == 0xd) {
        pbVar7 = pbVar7 + (ulong)(pbVar7[1] == 10) + 1;
      }
      else {
        pbVar7 = pbVar7 + 1;
        if (bVar3 != 10) {
          pxVar4->cur = pbVar7;
          pxVar4->col = pxVar4->col + 1;
          return;
        }
      }
      pxVar4->cur = pbVar7;
      pxVar4->line = pxVar4->line + 1;
      pxVar4->col = 1;
    }
  }
  return;
}

Assistant:

void
xmlNextChar(xmlParserCtxtPtr ctxt)
{
    const unsigned char *cur;
    size_t avail;
    int c;

    if ((ctxt == NULL) || (ctxt->input == NULL))
        return;

    avail = ctxt->input->end - ctxt->input->cur;

    if (avail < INPUT_CHUNK) {
        xmlParserGrow(ctxt);
        if (ctxt->input->cur >= ctxt->input->end)
            return;
        avail = ctxt->input->end - ctxt->input->cur;
    }

    cur = ctxt->input->cur;
    c = *cur;

    if (c < 0x80) {
        if (c == '\n') {
            ctxt->input->cur++;
            ctxt->input->line++;
            ctxt->input->col = 1;
        } else if (c == '\r') {
            /*
             *   2.11 End-of-Line Handling
             *   the literal two-character sequence "#xD#xA" or a standalone
             *   literal #xD, an XML processor must pass to the application
             *   the single character #xA.
             */
            ctxt->input->cur += ((cur[1] == '\n') ? 2 : 1);
            ctxt->input->line++;
            ctxt->input->col = 1;
            return;
        } else {
            ctxt->input->cur++;
            ctxt->input->col++;
        }
    } else {
        ctxt->input->col++;

        if ((avail < 2) || (cur[1] & 0xc0) != 0x80)
            goto encoding_error;

        if (c < 0xe0) {
            /* 2-byte code */
            if (c < 0xc2)
                goto encoding_error;
            ctxt->input->cur += 2;
        } else {
            unsigned int val = (c << 8) | cur[1];

            if ((avail < 3) || (cur[2] & 0xc0) != 0x80)
                goto encoding_error;

            if (c < 0xf0) {
                /* 3-byte code */
                if ((val < 0xe0a0) || ((val >= 0xeda0) && (val < 0xee00)))
                    goto encoding_error;
                ctxt->input->cur += 3;
            } else {
                if ((avail < 4) || ((cur[3] & 0xc0) != 0x80))
                    goto encoding_error;

                /* 4-byte code */
                if ((val < 0xf090) || (val >= 0xf490))
                    goto encoding_error;
                ctxt->input->cur += 4;
            }
        }
    }

    return;

encoding_error:
    /* Only report the first error */
    if ((ctxt->input->flags & XML_INPUT_ENCODING_ERROR) == 0) {
        xmlCtxtErrIO(ctxt, XML_ERR_INVALID_ENCODING, NULL);
        ctxt->input->flags |= XML_INPUT_ENCODING_ERROR;
    }
    ctxt->input->cur++;
}